

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

QVariant * __thiscall
QListWidgetItem::data(QVariant *__return_storage_ptr__,QListWidgetItem *this,int role)

{
  QWidgetItemData *pQVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  iVar3 = 0;
  if (role != 2) {
    iVar3 = role;
  }
  lVar4 = (this->d->values).d.size + 1;
  lVar2 = -0x20;
  do {
    lVar5 = lVar2;
    lVar4 = lVar4 + -1;
    if (lVar4 == 0) {
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
      (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
      *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
      *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
      return __return_storage_ptr__;
    }
    pQVar1 = (this->d->values).d.ptr;
    lVar2 = lVar5 + 0x28;
  } while (*(int *)(&(pQVar1->value).d.field_0x18 + lVar5) != iVar3);
  ::QVariant::QVariant(__return_storage_ptr__,(QVariant *)((long)&pQVar1[1].role + lVar5));
  return __return_storage_ptr__;
}

Assistant:

QVariant QListWidgetItem::data(int role) const
{
    role = (role == Qt::EditRole ? Qt::DisplayRole : role);
    for (int i = 0; i < d->values.size(); ++i)
        if (d->values.at(i).role == role)
            return d->values.at(i).value;
    return QVariant();
}